

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_kiss.c
# Opt level: O3

void csp_kiss_rx(csp_iface_t *iface,uint8_t *buf,size_t len,void *pxTaskWoken)

{
  uint uVar1;
  void *pvVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  int iVar5;
  csp_packet_t *packet;
  size_t sVar6;
  
  if (len != 0) {
    pvVar2 = iface->interface_data;
    sVar6 = 0;
    do {
      uVar4 = buf[sVar6];
      packet = *(csp_packet_t **)((long)pvVar2 + 0x18);
      if ((packet == (csp_packet_t *)0x0) ||
         ((csp_packet_t *)((packet->field_0).field_1.frame_begin + *(uint *)((long)pvVar2 + 0xc)) <
          packet + 1)) {
        switch(*(undefined4 *)((long)pvVar2 + 8)) {
        case 0:
          if (uVar4 == 0xc0) {
            if (packet == (csp_packet_t *)0x0) {
              if (pxTaskWoken == (void *)0x0) {
                packet = csp_buffer_get_always();
              }
              else {
                packet = csp_buffer_get_always_isr();
              }
              *(csp_packet_t **)((long)pvVar2 + 0x18) = packet;
              if (packet == (csp_packet_t *)0x0) {
                *(undefined4 *)((long)pvVar2 + 8) = 3;
                iface->drop = iface->drop + 1;
                break;
              }
            }
LAB_0010d09b:
            csp_id_setup_rx(packet);
            *(undefined8 *)((long)pvVar2 + 8) = 1;
            *(undefined1 *)((long)pvVar2 + 0x10) = 1;
          }
          break;
        case 1:
          if (uVar4 == 0xc0) {
            if (*(int *)((long)pvVar2 + 0xc) != 0) {
              (packet->field_0).field_1.frame_length = (uint16_t)*(int *)((long)pvVar2 + 0xc);
              iVar5 = csp_id_strip(*(csp_packet_t **)((long)pvVar2 + 0x18));
              if ((iVar5 < 0) ||
                 (iVar5 = csp_crc32_verify(*(csp_packet_t **)((long)pvVar2 + 0x18)), iVar5 != 0)) {
                iface->frame = iface->frame + 1;
              }
              else {
                csp_qfifo_write(*(csp_packet_t **)((long)pvVar2 + 0x18),iface,pxTaskWoken);
                *(undefined8 *)((long)pvVar2 + 0x18) = 0;
              }
              goto LAB_0010d1a0;
            }
          }
          else if (uVar4 == 0xdb) {
            *(undefined4 *)((long)pvVar2 + 8) = 2;
          }
          else if (*(char *)((long)pvVar2 + 0x10) == '\x01') {
            *(undefined1 *)((long)pvVar2 + 0x10) = 0;
          }
          else {
            puVar3 = (packet->field_0).field_1.frame_begin;
            uVar1 = *(uint *)((long)pvVar2 + 0xc);
            *(uint *)((long)pvVar2 + 0xc) = uVar1 + 1;
            puVar3[uVar1] = uVar4;
          }
          break;
        case 2:
          if (uVar4 == 0xdd) {
            uVar4 = 0xdb;
LAB_0010d0f2:
            puVar3 = (packet->field_0).field_1.frame_begin;
            uVar1 = *(uint *)((long)pvVar2 + 0xc);
            *(uint *)((long)pvVar2 + 0xc) = uVar1 + 1;
            puVar3[uVar1] = uVar4;
          }
          else if (uVar4 == 0xdc) {
            uVar4 = 0xc0;
            goto LAB_0010d0f2;
          }
          *(undefined4 *)((long)pvVar2 + 8) = 1;
          break;
        case 3:
          if (uVar4 == 0xc0) {
LAB_0010d1a0:
            *(undefined4 *)((long)pvVar2 + 8) = 0;
          }
        }
      }
      else {
        iface->rx_error = iface->rx_error + 1;
        *(undefined8 *)((long)pvVar2 + 8) = 0;
        if (uVar4 == 0xc0) goto LAB_0010d09b;
      }
      sVar6 = sVar6 + 1;
    } while (len != sVar6);
  }
  return;
}

Assistant:

void csp_kiss_rx(csp_iface_t * iface, const uint8_t * buf, size_t len, void * pxTaskWoken) {

	csp_kiss_interface_data_t * ifdata = iface->interface_data;

	while (len--) {

		/* Input */
		uint8_t inputbyte = *buf++;

		/* If packet was too long, truncate and restart */
		if (ifdata->rx_packet != NULL && &ifdata->rx_packet->frame_begin[ifdata->rx_length] >= &ifdata->rx_packet->data[sizeof(ifdata->rx_packet->data)]) {
			iface->rx_error++;
			ifdata->rx_mode = KISS_MODE_NOT_STARTED;
			ifdata->rx_length = 0;
		}

		switch (ifdata->rx_mode) {

			case KISS_MODE_NOT_STARTED:

				/* Skip any characters until End char detected */
				if (inputbyte != FEND) {
					break;
				}

				/* Always allocate new buffer */
				if (ifdata->rx_packet == NULL) {
					ifdata->rx_packet = pxTaskWoken ? csp_buffer_get_always_isr() : csp_buffer_get_always();
				}

				/* If no more memory, skip frame */
				if (ifdata->rx_packet == NULL) {
					ifdata->rx_mode = KISS_MODE_SKIP_FRAME;
					iface->drop++;
					break;
				}

				/* Start transfer */
				csp_id_setup_rx(ifdata->rx_packet);
				ifdata->rx_length = 0;
				ifdata->rx_mode = KISS_MODE_STARTED;
				ifdata->rx_first = true;
				break;

			case KISS_MODE_STARTED:

				/* Escape char */
				if (inputbyte == FESC) {
					ifdata->rx_mode = KISS_MODE_ESCAPED;
					break;
				}

				/* End Char */
				if (inputbyte == FEND) {

					/* Accept message */
					if (ifdata->rx_length > 0) {

						ifdata->rx_packet->frame_length = ifdata->rx_length;
						if (csp_id_strip(ifdata->rx_packet) < 0) {
							iface->frame++;
							ifdata->rx_mode = KISS_MODE_NOT_STARTED;
							break;
						}

						/* Validate CRC */
						if (csp_crc32_verify(ifdata->rx_packet) != CSP_ERR_NONE) {
							iface->frame++;
							ifdata->rx_mode = KISS_MODE_NOT_STARTED;
							break;
						}

						/* Send back into CSP, notice calling from task so last argument must be NULL! */
						csp_qfifo_write(ifdata->rx_packet, iface, pxTaskWoken);
						ifdata->rx_packet = NULL;
						ifdata->rx_mode = KISS_MODE_NOT_STARTED;
						break;
					}

					/* Break after the end char */
					break;
				}

				/* Skip the first char after FEND which is TNC_DATA (0x00) */
				if (ifdata->rx_first) {
					ifdata->rx_first = false;
					break;
				}

				/* Valid data char */
				ifdata->rx_packet->frame_begin[ifdata->rx_length++] = inputbyte;

				break;

			case KISS_MODE_ESCAPED:

				/* Escaped escape char */
				if (inputbyte == TFESC)
					ifdata->rx_packet->frame_begin[ifdata->rx_length++] = FESC;

				/* Escaped fend char */
				if (inputbyte == TFEND)
					ifdata->rx_packet->frame_begin[ifdata->rx_length++] = FEND;

				/* Go back to started mode */
				ifdata->rx_mode = KISS_MODE_STARTED;
				break;

			case KISS_MODE_SKIP_FRAME:

				/* Just wait for end char */
				if (inputbyte == FEND)
					ifdata->rx_mode = KISS_MODE_NOT_STARTED;

				break;
		}
	}
}